

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

pointer gmlc::networking::TcpServer::create
                  (io_context *io_context,string *address,uint16_t portNum,bool reuse_port,
                  int nominalBufferSize)

{
  bool reuse_port_00;
  uint16_t in_CX;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  io_context *in_RSI;
  element_type *in_RDI;
  byte in_R8B;
  pointer pVar1;
  int in_stack_00000010;
  element_type *sf;
  
  reuse_port_00 = (bool)(in_R8B & 1);
  sf = in_RDI;
  SocketFactory::SocketFactory((SocketFactory *)in_RDI);
  create((SocketFactory *)sf,in_RSI,in_RDX,in_CX,reuse_port_00,in_stack_00000010);
  SocketFactory::~SocketFactory((SocketFactory *)0x705ef3);
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (pointer)pVar1.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpServer::pointer TcpServer::create(
    asio::io_context& io_context,
    const std::string& address,
    uint16_t portNum,
    bool reuse_port,
    int nominalBufferSize)
{
    return TcpServer::create(
        SocketFactory(),
        io_context,
        address,
        portNum,
        reuse_port,
        nominalBufferSize);
}